

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

string * __thiscall
Diligent::Parsing::GetContext<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Pos,size_t NumLines)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  char cVar3;
  long lVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  byte bVar6;
  size_t LineAbove;
  char *pcVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var8;
  long lVar9;
  bool bVar10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_local;
  string msg;
  stringstream Ctx;
  ostream local_1a8 [376];
  
  Pos_local._M_current = (char *)End;
  if (*(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        **)this ==
      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)Start->_M_current) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&Ctx);
  }
  else {
    lVar4 = 0;
    do {
      lVar9 = lVar4;
      p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&End->_M_current + lVar9);
      if ((p_Var8 <= *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       **)this) || (cVar3 = *(char *)((long)End + lVar9 + -1), cVar3 == '\r'))
      break;
      lVar4 = lVar9 + -1;
    } while (cVar3 != '\n');
    Pos_local = SkipLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (&Pos_local,Start,false);
    std::__cxx11::stringstream::stringstream((stringstream *)&Ctx);
    lVar9 = -lVar9;
    p_Var5 = *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               **)this;
    pcVar7 = (char *)0x0;
    while ((pcVar7 < Pos._M_current && (p_Var5 < p_Var8))) {
      p_Var2 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&p_Var8[-1]._M_current + 7);
      bVar6 = *(byte *)((long)&p_Var8[-1]._M_current + 7);
      if ((bVar6 != 10) && (bVar6 != 0xd)) {
        FormatString<char[26],char[24]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5da95f,
                   (char (*) [24])(ulong)bVar6);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetContext",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                   ,0x212);
        std::__cxx11::string::~string((string *)&msg);
        bVar6 = *(byte *)&p_Var2->_M_current;
        p_Var5 = *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   **)this;
      }
      if (((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&p_Var5->_M_current + 1U) < p_Var8 && bVar6 == 10) &&
         (*(char *)((long)&p_Var8[-1]._M_current + 6) == '\r')) {
        p_Var8 = p_Var2;
      }
      End = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)p_Var8 - (ulong)(p_Var5 < p_Var8));
      do {
        p_Var8 = End;
        End = p_Var8;
        if ((p_Var8 <= p_Var5) ||
           (cVar3 = *(char *)((long)&p_Var8[-1]._M_current + 7), cVar3 == '\r')) break;
        End = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&p_Var8[-1]._M_current + 7);
      } while (cVar3 != '\n');
      pcVar7 = pcVar7 + 1;
    }
    if (((p_Var8 != p_Var5) && (cVar3 = *(char *)((long)&p_Var8[-1]._M_current + 7), cVar3 != '\n'))
       && (cVar3 != '\r')) {
      FormatString<char[26],char[45]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",(char (*) [45])End);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::ostream::write((char *)local_1a8,(long)p_Var8);
    std::endl<char,std::char_traits<char>>(local_1a8);
    while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
      std::operator<<(local_1a8,' ');
    }
    std::operator<<(local_1a8,'^');
    if (Pos_local._M_current != Start->_M_current) {
      msg._M_dataplus._M_p = (pointer)Pos_local;
      while ((bVar10 = Pos._M_current != (char *)0x0, Pos._M_current = Pos._M_current + -1, bVar10
             && (pcVar7 = Start->_M_current, msg._M_dataplus._M_p != pcVar7))) {
        if (*msg._M_dataplus._M_p == '\r') {
          pcVar1 = msg._M_dataplus._M_p + 1;
          if ((pcVar1 != pcVar7) && (*pcVar1 == '\n')) {
            msg._M_dataplus._M_p = pcVar1;
          }
        }
        else if (*msg._M_dataplus._M_p == '\0') break;
        if (msg._M_dataplus._M_p != pcVar7) {
          msg._M_dataplus._M_p = msg._M_dataplus._M_p + 1;
        }
        msg._M_dataplus._M_p =
             (pointer)SkipLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&msg,Start,false);
      }
      std::ostream::write((char *)local_1a8,(long)Pos_local._M_current);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&Ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}